

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O0

void eval_cb_kdtree(s2_semi_mgau_t *s,int32 feat,mfcc_t *z,kd_tree_node_t *node,uint32 maxbbi)

{
  int iVar1;
  vqFeature_t *pvVar2;
  bool bVar3;
  vqFeature_t *pvVar4;
  uint uVar5;
  vqFeature_t *pvVar6;
  float fVar7;
  int local_94;
  int local_90;
  int32 k;
  int32 j;
  int32 cw;
  vqFeature_t *cur;
  mfcc_t *obs;
  float *pfStack_70;
  mfcc_t d;
  mfcc_t *var;
  mfcc_t compl;
  mfcc_t sqdiff;
  mfcc_t diff;
  mfcc_t *mean;
  int32 ceplen;
  int32 i;
  vqFeature_t *topn;
  vqFeature_t *best;
  vqFeature_t *worst;
  uint32 maxbbi_local;
  kd_tree_node_t *node_local;
  mfcc_t *z_local;
  int32 feat_local;
  s2_semi_mgau_t *s_local;
  
  pvVar2 = s->f[feat];
  pvVar6 = pvVar2 + (s->max_topn + -1);
  iVar1 = s->veclen[feat];
  for (mean._4_4_ = 0; mean._4_4_ < maxbbi; mean._4_4_ = mean._4_4_ + 1) {
    uVar5 = (uint)node->bbi[(int)mean._4_4_];
    pfStack_70 = (float *)(s->vars[feat] + (int)(uVar5 * iVar1));
    obs._4_4_ = s->dets[feat][(int)uVar5];
    local_90 = 0;
    cur = (vqFeature_t *)z;
    _sqdiff = (float *)(s->means[feat] + (int)(uVar5 * iVar1));
    while( true ) {
      bVar3 = false;
      if (local_90 < iVar1) {
        bVar3 = (float)pvVar6->score <= (float)obs._4_4_;
      }
      if (!bVar3) break;
      fVar7 = (float)cur->score - *_sqdiff;
      obs._4_4_ = (mfcc_t)((float)obs._4_4_ - fVar7 * fVar7 * *pfStack_70);
      pfStack_70 = pfStack_70 + 1;
      local_90 = local_90 + 1;
      cur = (vqFeature_t *)&cur->codeword;
      _sqdiff = _sqdiff + 1;
    }
    if ((iVar1 <= local_90) && (pvVar6->score <= (int)(float)obs._4_4_)) {
      local_94 = 0;
      while ((local_94 < s->max_topn && (pvVar2[local_94].codeword != uVar5))) {
        local_94 = local_94 + 1;
      }
      pvVar4 = pvVar6;
      if (s->max_topn <= local_94) {
        while( true ) {
          _j = pvVar4 + -1;
          bVar3 = false;
          if (pvVar2 <= _j) {
            bVar3 = _j->score <= (int)(float)obs._4_4_;
          }
          if (!bVar3) break;
          *pvVar4 = *_j;
          pvVar4 = _j;
        }
        pvVar4->codeword = uVar5;
        pvVar4->score = (int)(float)obs._4_4_;
      }
    }
  }
  return;
}

Assistant:

static void
eval_cb_kdtree(s2_semi_mgau_t *s, int32 feat, mfcc_t *z,
               kd_tree_node_t *node, uint32 maxbbi)
{
    vqFeature_t *worst, *best, *topn;
    int32 i, ceplen;

    best = topn = s->f[feat];
    worst = topn + (s->max_topn - 1);
    ceplen = s->veclen[feat];

    for (i = 0; i < maxbbi; ++i) {
        mfcc_t *mean, diff, sqdiff, compl; /* diff, diff^2, component likelihood */
        mfcc_t *var, d;
        mfcc_t *obs;
        vqFeature_t *cur;
        int32 cw, j, k;

        cw = node->bbi[i];
        mean = s->means[feat] + cw * ceplen;
        var = s->vars[feat] + cw * ceplen;
        d = s->dets[feat][cw];
        obs = z;
        for (j = 0; (j < ceplen) && (d >= worst->score); j++) {
            diff = *obs++ - *mean++;
            sqdiff = MFCCMUL(diff, diff);
            compl = MFCCMUL(sqdiff, *var);
            d = GMMSUB(d, compl);
            ++var;
        }
        if (j < ceplen)
            continue;
        if ((int32)d < worst->score)
            continue;
        for (k = 0; k < s->max_topn; k++) {
            /* already there, so don't need to insert */
            if (topn[k].codeword == cw)
                break;
        }
        if (k < s->max_topn)
            continue;       /* already there.  Don't insert */
        /* remaining code inserts codeword and dist in correct spot */
        for (cur = worst - 1; cur >= best && (int32)d >= cur->score; --cur)
            memcpy(cur + 1, cur, sizeof(vqFeature_t));
        ++cur;
        cur->codeword = cw;
        cur->score = (int32)d;
    }
}